

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O2

void __thiscall PF_HashTable::~PF_HashTable(PF_HashTable *this)

{
  PF_HashEntry **ppPVar1;
  PF_HashEntry *pPVar2;
  PF_HashEntry *pPVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0; ppPVar1 = this->hashTable, lVar4 < this->numBuckets; lVar4 = lVar4 + 1) {
    pPVar3 = ppPVar1[lVar4];
    while (pPVar3 != (PF_HashEntry *)0x0) {
      pPVar2 = pPVar3->next;
      operator_delete(pPVar3);
      pPVar3 = pPVar2;
    }
  }
  if (ppPVar1 != (PF_HashEntry **)0x0) {
    operator_delete__(ppPVar1);
    return;
  }
  return;
}

Assistant:

PF_HashTable::~PF_HashTable()
{
  // Clear out all buckets
  for (int i = 0; i < numBuckets; i++) {

    // Delete all entries in the bucket
    PF_HashEntry *entry = hashTable[i];
    while (entry != NULL) {
      PF_HashEntry *next = entry->next;
      delete entry;
      entry = next;
    }
  }

  // Finally delete the hash table
  delete[] hashTable;
}